

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elu_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::ELU_x86_fma::forward_inplace(ELU_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  undefined1 auVar6 [32];
  ulong uVar7;
  long lVar8;
  undefined1 (*pauVar9) [32];
  int iVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [64];
  undefined1 auVar42 [16];
  undefined1 auVar43 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 extraout_var [60];
  
  iVar10 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  uVar12 = 0;
  uVar7 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar7 = uVar12;
  }
  auVar36 = ZEXT1664(ZEXT816(0) << 0x40);
  auVar41 = ZEXT3264(CONCAT428(0x3f000000,
                               CONCAT424(0x3f000000,
                                         CONCAT420(0x3f000000,
                                                   CONCAT416(0x3f000000,
                                                             CONCAT412(0x3f000000,
                                                                       CONCAT48(0x3f000000,
                                                                                0x3f0000003f000000))
                                                            )))));
  auVar43 = ZEXT3264(CONCAT428(0x3f800000,
                               CONCAT424(0x3f800000,
                                         CONCAT420(0x3f800000,
                                                   CONCAT416(0x3f800000,
                                                             CONCAT412(0x3f800000,
                                                                       CONCAT48(0x3f800000,
                                                                                0x3f8000003f800000))
                                                            )))));
  auVar48 = ZEXT3264(CONCAT428(0x395e8083,
                               CONCAT424(0x395e8083,
                                         CONCAT420(0x395e8083,
                                                   CONCAT416(0x395e8083,
                                                             CONCAT412(0x395e8083,
                                                                       CONCAT48(0x395e8083,
                                                                                0x395e8083395e8083))
                                                            )))));
  auVar49 = ZEXT3264(CONCAT428(0x3ab743ce,
                               CONCAT424(0x3ab743ce,
                                         CONCAT420(0x3ab743ce,
                                                   CONCAT416(0x3ab743ce,
                                                             CONCAT412(0x3ab743ce,
                                                                       CONCAT48(0x3ab743ce,
                                                                                0x3ab743ce3ab743ce))
                                                            )))));
  auVar50 = ZEXT3264(CONCAT428(0x39506967,
                               CONCAT424(0x39506967,
                                         CONCAT420(0x39506967,
                                                   CONCAT416(0x39506967,
                                                             CONCAT412(0x39506967,
                                                                       CONCAT48(0x39506967,
                                                                                0x3950696739506967))
                                                            )))));
  for (; uVar12 != uVar7; uVar12 = uVar12 + 1) {
    pvVar3 = bottom_top_blob->data;
    sVar4 = bottom_top_blob->elemsize;
    sVar5 = bottom_top_blob->cstep;
    pauVar9 = (undefined1 (*) [32])(sVar5 * uVar12 * sVar4 + (long)pvVar3);
    fVar1 = (this->super_ELU).alpha;
    auVar14._4_4_ = fVar1;
    auVar14._0_4_ = fVar1;
    auVar14._8_4_ = fVar1;
    auVar14._12_4_ = fVar1;
    auVar14._16_4_ = fVar1;
    auVar14._20_4_ = fVar1;
    auVar14._24_4_ = fVar1;
    auVar14._28_4_ = fVar1;
    lVar13 = 0;
    for (iVar11 = 0; iVar11 + 7 < iVar10; iVar11 = iVar11 + 8) {
      auVar19 = vminps_avx(*pauVar9,auVar36._0_32_);
      auVar25._8_4_ = 0x42b0c0a5;
      auVar25._0_8_ = 0x42b0c0a542b0c0a5;
      auVar25._12_4_ = 0x42b0c0a5;
      auVar25._16_4_ = 0x42b0c0a5;
      auVar25._20_4_ = 0x42b0c0a5;
      auVar25._24_4_ = 0x42b0c0a5;
      auVar25._28_4_ = 0x42b0c0a5;
      auVar19 = vminps_avx(auVar19,auVar25);
      auVar26._8_4_ = 0xc2b0c0a5;
      auVar26._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar26._12_4_ = 0xc2b0c0a5;
      auVar26._16_4_ = 0xc2b0c0a5;
      auVar26._20_4_ = 0xc2b0c0a5;
      auVar26._24_4_ = 0xc2b0c0a5;
      auVar26._28_4_ = 0xc2b0c0a5;
      auVar6 = vmaxps_avx(auVar19,auVar26);
      auVar27._8_4_ = 0x3fb8aa3b;
      auVar27._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar27._12_4_ = 0x3fb8aa3b;
      auVar27._16_4_ = 0x3fb8aa3b;
      auVar27._20_4_ = 0x3fb8aa3b;
      auVar27._24_4_ = 0x3fb8aa3b;
      auVar27._28_4_ = 0x3fb8aa3b;
      auVar16 = vfmadd213ps_fma(auVar27,auVar6,auVar41._0_32_);
      auVar18 = vroundps_avx(ZEXT1632(auVar16),1);
      auVar19 = vcmpps_avx(ZEXT1632(auVar16),auVar18,1);
      auVar19 = vandps_avx(auVar43._0_32_,auVar19);
      auVar19 = vsubps_avx(auVar18,auVar19);
      auVar34._8_4_ = 0x3f318000;
      auVar34._0_8_ = 0x3f3180003f318000;
      auVar34._12_4_ = 0x3f318000;
      auVar34._16_4_ = 0x3f318000;
      auVar34._20_4_ = 0x3f318000;
      auVar34._24_4_ = 0x3f318000;
      auVar34._28_4_ = 0x3f318000;
      auVar16 = vfmsub231ps_fma(auVar6,auVar19,auVar34);
      auVar20 = vfmsub231ps_fma(ZEXT1632(auVar16),auVar19,auVar48._0_32_);
      auVar18 = ZEXT1632(auVar20);
      auVar6._28_4_ = 0x3f318000;
      auVar6._0_28_ =
           ZEXT1628(CONCAT412(auVar20._12_4_ * auVar20._12_4_,
                              CONCAT48(auVar20._8_4_ * auVar20._8_4_,
                                       CONCAT44(auVar20._4_4_ * auVar20._4_4_,
                                                auVar20._0_4_ * auVar20._0_4_))));
      auVar16 = vfmadd213ps_fma(auVar50._0_32_,auVar18,auVar49._0_32_);
      auVar38._8_4_ = 0x3c088908;
      auVar38._0_8_ = 0x3c0889083c088908;
      auVar38._12_4_ = 0x3c088908;
      auVar38._16_4_ = 0x3c088908;
      auVar38._20_4_ = 0x3c088908;
      auVar38._24_4_ = 0x3c088908;
      auVar38._28_4_ = 0x3c088908;
      auVar16 = vfmadd213ps_fma(ZEXT1632(auVar16),auVar18,auVar38);
      auVar39._8_4_ = 0x3d2aa9c1;
      auVar39._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar39._12_4_ = 0x3d2aa9c1;
      auVar39._16_4_ = 0x3d2aa9c1;
      auVar39._20_4_ = 0x3d2aa9c1;
      auVar39._24_4_ = 0x3d2aa9c1;
      auVar39._28_4_ = 0x3d2aa9c1;
      auVar16 = vfmadd213ps_fma(ZEXT1632(auVar16),auVar18,auVar39);
      auVar40._8_4_ = 0x3e2aaaaa;
      auVar40._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar40._12_4_ = 0x3e2aaaaa;
      auVar40._16_4_ = 0x3e2aaaaa;
      auVar40._20_4_ = 0x3e2aaaaa;
      auVar40._24_4_ = 0x3e2aaaaa;
      auVar40._28_4_ = 0x3e2aaaaa;
      auVar18 = ZEXT1632(auVar20);
      auVar16 = vfmadd213ps_fma(ZEXT1632(auVar16),auVar18,auVar40);
      auVar16 = vfmadd213ps_fma(ZEXT1632(auVar16),auVar18,auVar41._0_32_);
      auVar21 = vfmadd213ps_fma(ZEXT1632(auVar16),auVar6,auVar18);
      auVar16._0_4_ = (int)auVar19._0_4_;
      auVar16._4_4_ = (int)auVar19._4_4_;
      auVar16._8_4_ = (int)auVar19._8_4_;
      auVar16._12_4_ = (int)auVar19._12_4_;
      auVar18._16_4_ = (int)auVar19._16_4_;
      auVar18._0_16_ = auVar16;
      auVar18._20_4_ = (int)auVar19._20_4_;
      auVar18._24_4_ = (int)auVar19._24_4_;
      auVar18._28_4_ = (int)auVar19._28_4_;
      auVar20 = vpslld_avx(auVar16,0x17);
      auVar16 = vpslld_avx(auVar18._16_16_,0x17);
      auVar29._8_4_ = 0x3f800000;
      auVar29._0_8_ = 0x3f8000003f800000;
      auVar29._12_4_ = 0x3f800000;
      auVar16 = vpaddd_avx(auVar16,auVar29);
      auVar20 = vpaddd_avx(auVar20,auVar29);
      auVar19._16_16_ = auVar16;
      auVar19._0_16_ = auVar20;
      auVar28._0_4_ = auVar43._0_4_ + auVar21._0_4_;
      auVar28._4_4_ = auVar43._4_4_ + auVar21._4_4_;
      auVar28._8_4_ = auVar43._8_4_ + auVar21._8_4_;
      auVar28._12_4_ = auVar43._12_4_ + auVar21._12_4_;
      auVar28._16_4_ = auVar43._16_4_ + 0.0;
      auVar28._20_4_ = auVar43._20_4_ + 0.0;
      auVar28._24_4_ = auVar43._24_4_ + 0.0;
      auVar28._28_4_ = auVar43._28_4_ + 0.0;
      auVar16 = vfmsub213ps_fma(auVar19,auVar28,auVar43._0_32_);
      auVar19 = vmaxps_avx(*pauVar9,auVar36._0_32_);
      auVar16 = vfmadd213ps_fma(ZEXT1632(auVar16),auVar14,auVar19);
      *pauVar9 = ZEXT1632(auVar16);
      pauVar9 = pauVar9 + 1;
      lVar13 = lVar13 + 8;
    }
    fVar1 = (this->super_ELU).alpha;
    auVar20._4_4_ = fVar1;
    auVar20._0_4_ = fVar1;
    auVar20._8_4_ = fVar1;
    auVar20._12_4_ = fVar1;
    for (; iVar11 + 3 < iVar10; iVar11 = iVar11 + 4) {
      auVar16 = vminps_avx(ZEXT816(0) << 0x40,*(undefined1 (*) [16])*pauVar9);
      auVar21._8_4_ = 0x42b0c0a5;
      auVar21._0_8_ = 0x42b0c0a542b0c0a5;
      auVar21._12_4_ = 0x42b0c0a5;
      auVar16 = vminps_avx(auVar16,auVar21);
      auVar22._8_4_ = 0xc2b0c0a5;
      auVar22._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar22._12_4_ = 0xc2b0c0a5;
      auVar29 = vmaxps_avx(auVar16,auVar22);
      auVar23._8_4_ = 0x3fb8aa3b;
      auVar23._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar23._12_4_ = 0x3fb8aa3b;
      auVar42._8_4_ = 0x3f000000;
      auVar42._0_8_ = 0x3f0000003f000000;
      auVar42._12_4_ = 0x3f000000;
      auVar16 = vfmadd213ps_fma(auVar23,auVar29,auVar42);
      auVar30._0_4_ = (int)auVar16._0_4_;
      auVar30._4_4_ = (int)auVar16._4_4_;
      auVar30._8_4_ = (int)auVar16._8_4_;
      auVar30._12_4_ = (int)auVar16._12_4_;
      auVar21 = vcvtdq2ps_avx(auVar30);
      auVar16 = vcmpps_avx(auVar16,auVar21,1);
      auVar37._8_4_ = 0x3f800000;
      auVar37._0_8_ = 0x3f8000003f800000;
      auVar37._12_4_ = 0x3f800000;
      auVar16 = vandps_avx(auVar16,auVar37);
      auVar16 = vsubps_avx(auVar21,auVar16);
      auVar31._8_4_ = 0x3f318000;
      auVar31._0_8_ = 0x3f3180003f318000;
      auVar31._12_4_ = 0x3f318000;
      auVar21 = vfmsub231ps_fma(auVar29,auVar16,auVar31);
      auVar32._8_4_ = 0x395e8083;
      auVar32._0_8_ = 0x395e8083395e8083;
      auVar32._12_4_ = 0x395e8083;
      auVar29 = vfmsub231ps_fma(auVar21,auVar16,auVar32);
      auVar33._0_4_ = auVar29._0_4_ * auVar29._0_4_;
      auVar33._4_4_ = auVar29._4_4_ * auVar29._4_4_;
      auVar33._8_4_ = auVar29._8_4_ * auVar29._8_4_;
      auVar33._12_4_ = auVar29._12_4_ * auVar29._12_4_;
      auVar35._8_4_ = 0x39506967;
      auVar35._0_8_ = 0x3950696739506967;
      auVar35._12_4_ = 0x39506967;
      auVar44._8_4_ = 0x3ab743ce;
      auVar44._0_8_ = 0x3ab743ce3ab743ce;
      auVar44._12_4_ = 0x3ab743ce;
      auVar21 = vfmadd213ps_fma(auVar35,auVar29,auVar44);
      auVar45._8_4_ = 0x3c088908;
      auVar45._0_8_ = 0x3c0889083c088908;
      auVar45._12_4_ = 0x3c088908;
      auVar21 = vfmadd213ps_fma(auVar21,auVar29,auVar45);
      auVar46._8_4_ = 0x3d2aa9c1;
      auVar46._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar46._12_4_ = 0x3d2aa9c1;
      auVar21 = vfmadd213ps_fma(auVar21,auVar29,auVar46);
      auVar47._8_4_ = 0x3e2aaaaa;
      auVar47._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar47._12_4_ = 0x3e2aaaaa;
      auVar21 = vfmadd213ps_fma(auVar21,auVar29,auVar47);
      auVar21 = vfmadd213ps_fma(auVar21,auVar29,auVar42);
      auVar21 = vfmadd213ps_fma(auVar21,auVar33,auVar29);
      auVar17._0_4_ = auVar21._0_4_ + 1.0;
      auVar17._4_4_ = auVar21._4_4_ + 1.0;
      auVar17._8_4_ = auVar21._8_4_ + 1.0;
      auVar17._12_4_ = auVar21._12_4_ + 1.0;
      auVar24._0_4_ = (int)auVar16._0_4_;
      auVar24._4_4_ = (int)auVar16._4_4_;
      auVar24._8_4_ = (int)auVar16._8_4_;
      auVar24._12_4_ = (int)auVar16._12_4_;
      auVar16 = vpslld_avx(auVar24,0x17);
      auVar16 = vpaddd_avx(auVar16,auVar37);
      auVar21 = vfmsub213ps_fma(auVar16,auVar17,auVar37);
      auVar16 = vmaxps_avx(ZEXT816(0) << 0x40,*(undefined1 (*) [16])*pauVar9);
      auVar16 = vfmadd213ps_fma(auVar21,auVar20,auVar16);
      *(undefined1 (*) [16])*pauVar9 = auVar16;
      pauVar9 = (undefined1 (*) [32])(*pauVar9 + 0x10);
      lVar13 = lVar13 + 4;
    }
    lVar8 = sVar5 * sVar4 * uVar12;
    for (; (int)lVar13 < iVar10; lVar13 = lVar13 + 1) {
      fVar1 = *(float *)((long)pvVar3 + lVar13 * 4 + lVar8);
      if (fVar1 < 0.0) {
        fVar2 = (this->super_ELU).alpha;
        auVar15._0_4_ = expf(fVar1);
        auVar15._4_60_ = extraout_var;
        auVar50 = ZEXT3264(CONCAT428(0x39506967,
                                     CONCAT424(0x39506967,
                                               CONCAT420(0x39506967,
                                                         CONCAT416(0x39506967,
                                                                   CONCAT412(0x39506967,
                                                                             CONCAT48(0x39506967,
                                                                                                                                                                            
                                                  0x3950696739506967)))))));
        auVar49 = ZEXT3264(CONCAT428(0x3ab743ce,
                                     CONCAT424(0x3ab743ce,
                                               CONCAT420(0x3ab743ce,
                                                         CONCAT416(0x3ab743ce,
                                                                   CONCAT412(0x3ab743ce,
                                                                             CONCAT48(0x3ab743ce,
                                                                                                                                                                            
                                                  0x3ab743ce3ab743ce)))))));
        auVar48 = ZEXT3264(CONCAT428(0x395e8083,
                                     CONCAT424(0x395e8083,
                                               CONCAT420(0x395e8083,
                                                         CONCAT416(0x395e8083,
                                                                   CONCAT412(0x395e8083,
                                                                             CONCAT48(0x395e8083,
                                                                                                                                                                            
                                                  0x395e8083395e8083)))))));
        auVar43 = ZEXT3264(CONCAT428(0x3f800000,
                                     CONCAT424(0x3f800000,
                                               CONCAT420(0x3f800000,
                                                         CONCAT416(0x3f800000,
                                                                   CONCAT412(0x3f800000,
                                                                             CONCAT48(0x3f800000,
                                                                                                                                                                            
                                                  0x3f8000003f800000)))))));
        auVar41 = ZEXT3264(CONCAT428(0x3f000000,
                                     CONCAT424(0x3f000000,
                                               CONCAT420(0x3f000000,
                                                         CONCAT416(0x3f000000,
                                                                   CONCAT412(0x3f000000,
                                                                             CONCAT48(0x3f000000,
                                                                                                                                                                            
                                                  0x3f0000003f000000)))))));
        auVar36 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar16 = ZEXT416((uint)fVar2);
        auVar16 = vfmsub213ss_fma(auVar15._0_16_,auVar16,auVar16);
        *(int *)((long)pvVar3 + lVar13 * 4 + lVar8) = auVar16._0_4_;
      }
    }
  }
  return 0;
}

Assistant:

int ELU_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _alpha512 = _mm512_set1_ps(alpha);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _mm512_storeu_ps(ptr, elu_avx512(_p, _alpha512));

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _alpha256 = _mm256_set1_ps(alpha);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, elu_avx(_p, _alpha256));

            ptr += 8;
        }
#endif // __AVX__
        __m128 _alpha128 = _mm_set1_ps(alpha);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _mm_store_ps(ptr, elu_sse(_p, _alpha128));

            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < 0.f)
                *ptr = alpha * (expf(*ptr) - 1.f);
            ptr++;
        }
    }

    return 0;
}